

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O0

ares_status_t ares_conn_flush(ares_conn_t *conn)

{
  size_t sVar1;
  ares_conn_state_flags_t local_44;
  ushort local_3e;
  ares_conn_state_flags_t flags;
  ares_status_t aStack_38;
  unsigned_short msg_len;
  ares_bool_t tfo;
  ares_status_t status;
  ares_conn_err_t err;
  size_t count;
  size_t data_len;
  uchar *data;
  ares_conn_t *conn_local;
  
  if (conn == (ares_conn_t *)0x0) {
    conn_local._4_4_ = ARES_EFORMERR;
  }
  else {
    flags = (ares_conn_state_flags_t)
            ((conn->flags & ARES_CONN_FLAG_TFO_INITIAL) != ARES_CONN_FLAG_NONE);
    data = (uchar *)conn;
    do {
      sVar1 = ares_buf_len(*(ares_buf_t **)(data + 0x28));
      if (sVar1 == 0) {
        aStack_38 = ARES_SUCCESS;
        break;
      }
      if ((*(uint *)(data + 0x20) & 1) == 0) {
        ares_buf_tag(*(ares_buf_t **)(data + 0x28));
        aStack_38 = ares_buf_fetch_be16(*(ares_buf_t **)(data + 0x28),&local_3e);
        if (aStack_38 != ARES_SUCCESS) {
          return aStack_38;
        }
        ares_buf_tag_rollback(*(ares_buf_t **)(data + 0x28));
        data_len = (size_t)ares_buf_peek(*(ares_buf_t **)(data + 0x28),&count);
        if (count < (ulong)(long)(int)(local_3e + 2)) {
          aStack_38 = ARES_EFORMERR;
          break;
        }
        data_len = data_len + 2;
        count = (size_t)local_3e;
      }
      else {
        data_len = (size_t)ares_buf_peek(*(ares_buf_t **)(data + 0x28),&count);
      }
      tfo = ares_conn_write((ares_conn_t *)data,(void *)data_len,count,(size_t *)&status);
      if (tfo != ARES_FALSE) {
        if (tfo == ARES_TRUE) {
          aStack_38 = ARES_SUCCESS;
        }
        else {
          aStack_38 = ARES_ECONNREFUSED;
        }
        break;
      }
      if ((*(uint *)(data + 0x20) & 1) == 0) {
        _status = _status + 2;
      }
      ares_buf_consume(*(ares_buf_t **)(data + 0x28),_status);
      aStack_38 = ARES_SUCCESS;
    } while ((*(uint *)(data + 0x20) & 1) == 0);
    if (aStack_38 == ARES_SUCCESS) {
      local_44 = ARES_CONN_STATE_READ;
      if (flags != ARES_CONN_STATE_NONE) {
        local_44 = ARES_CONN_STATE_CBFLAGS;
      }
      if (((*(uint *)(data + 0x20) & 1) != 0) &&
         (sVar1 = ares_buf_len(*(ares_buf_t **)(data + 0x28)), sVar1 != 0)) {
        local_44 = local_44 | ARES_CONN_STATE_WRITE;
      }
      ares_conn_sock_state_cb_update((ares_conn_t *)data,local_44);
    }
    conn_local._4_4_ = aStack_38;
  }
  return conn_local._4_4_;
}

Assistant:

ares_status_t ares_conn_flush(ares_conn_t *conn)
{
  const unsigned char *data;
  size_t               data_len;
  size_t               count;
  ares_conn_err_t      err;
  ares_status_t        status;
  ares_bool_t          tfo = ARES_FALSE;

  if (conn == NULL) {
    return ARES_EFORMERR;
  }

  if (conn->flags & ARES_CONN_FLAG_TFO_INITIAL) {
    tfo = ARES_TRUE;
  }

  do {
    if (ares_buf_len(conn->out_buf) == 0) {
      status = ARES_SUCCESS;
      goto done;
    }

    if (conn->flags & ARES_CONN_FLAG_TCP) {
      data = ares_buf_peek(conn->out_buf, &data_len);
    } else {
      unsigned short msg_len;

      /* Read length, then provide buffer without length */
      ares_buf_tag(conn->out_buf);
      status = ares_buf_fetch_be16(conn->out_buf, &msg_len);
      if (status != ARES_SUCCESS) {
        return status;
      }
      ares_buf_tag_rollback(conn->out_buf);

      data = ares_buf_peek(conn->out_buf, &data_len);
      if (data_len < (size_t)(msg_len + 2)) {
        status = ARES_EFORMERR;
        goto done;
      }
      data     += 2;
      data_len  = msg_len;
    }

    err = ares_conn_write(conn, data, data_len, &count);
    if (err != ARES_CONN_ERR_SUCCESS) {
      if (err != ARES_CONN_ERR_WOULDBLOCK) {
        status = ARES_ECONNREFUSED;
        goto done;
      }
      status = ARES_SUCCESS;
      goto done;
    }

    /* UDP didn't send the length prefix so augment that here */
    if (!(conn->flags & ARES_CONN_FLAG_TCP)) {
      count += 2;
    }

    /* Strip data written from the buffer */
    ares_buf_consume(conn->out_buf, count);
    status = ARES_SUCCESS;

    /* Loop only for UDP since we have to send per-packet.  We already
     * sent everything we could if using tcp */
  } while (!(conn->flags & ARES_CONN_FLAG_TCP));

done:
  if (status == ARES_SUCCESS) {
    ares_conn_state_flags_t flags = ARES_CONN_STATE_READ;

    /* When using TFO, the we need to enabling waiting on a write event to
     * be notified of when a connection is actually established */
    if (tfo) {
      flags |= ARES_CONN_STATE_WRITE;
    }

    /* If using TCP and not all data was written (partial write), that means
     * we need to also wait on a write event */
    if (conn->flags & ARES_CONN_FLAG_TCP && ares_buf_len(conn->out_buf)) {
      flags |= ARES_CONN_STATE_WRITE;
    }

    ares_conn_sock_state_cb_update(conn, flags);
  }

  return status;
}